

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4161a3::PointerType::printRight(PointerType *this,OutputStream *s)

{
  Kind KVar1;
  bool bVar2;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *s_local;
  PointerType *this_local;
  
  local_18 = s;
  s_local = (OutputStream *)this;
  KVar1 = Node::getKind(this->Pointee);
  if ((KVar1 != KObjCProtoName) ||
     (bVar2 = ObjCProtoName::isObjCObject((ObjCProtoName *)this->Pointee), !bVar2)) {
    bVar2 = Node::hasArray(this->Pointee,local_18);
    if ((bVar2) || (bVar2 = Node::hasFunction(this->Pointee,local_18), bVar2)) {
      StringView::StringView(&local_28,")");
      OutputStream::operator+=(local_18,local_28);
    }
    (*this->Pointee->_vptr_Node[5])(this->Pointee,local_18);
  }
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += ")";
      Pointee->printRight(s);
    }
  }